

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
bssl::der::test::ParserTest_LengthMustBeEncodedWithMinimumNumberOfOctets_Test::TestBody
          (ParserTest_LengthMustBeEncodedWithMinimumNumberOfOctets_Test *this)

{
  bool bVar1;
  char *in_R9;
  Input input;
  AssertionResult gtest_ar_;
  CBS_ASN1_TAG tag;
  uint8_t der [4];
  Parser parser;
  Input value;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  CBS_ASN1_TAG local_48;
  uchar local_44 [4];
  Parser local_40;
  Input local_28;
  
  local_44[0] = '\x01';
  local_44[1] = 0x81;
  local_44[2] = '\x01';
  local_44[3] = '\0';
  input.data_.size_ = 4;
  input.data_.data_ = local_44;
  Parser::Parser(&local_40,input);
  local_28.data_.data_ = (uchar *)0x0;
  local_28.data_.size_ = 0;
  bVar1 = Parser::ReadTagAndValue(&local_40,&local_48,&local_28);
  local_78[0] = (internal)!bVar1;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_78[0]) {
    local_78[0] = (internal)Parser::HasMore(&local_40);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_78[0]) goto LAB_002a0c17;
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_78,(AssertionResult *)"parser.HasMore()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
               ,0x129,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
  }
  else {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_78,(AssertionResult *)"parser.ReadTagAndValue(&tag, &value)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
               ,0x128,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
LAB_002a0c17:
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(ParserTest, LengthMustBeEncodedWithMinimumNumberOfOctets) {
  const uint8_t der[] = {0x01, 0x81, 0x01, 0x00};
  Parser parser((Input(der)));

  CBS_ASN1_TAG tag;
  Input value;
  ASSERT_FALSE(parser.ReadTagAndValue(&tag, &value));
  ASSERT_TRUE(parser.HasMore());
}